

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O3

RefCountedPtr<raptor::Status> __thiscall raptor::MakeStatusFromPosixError(raptor *this,char *api)

{
  int __errnum;
  int *piVar1;
  char *pcVar2;
  undefined8 *puVar3;
  char *text;
  allocator local_49;
  char *local_48;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  piVar1 = __errno_location();
  __errnum = *piVar1;
  local_48 = (char *)0x0;
  pcVar2 = strerror(__errnum);
  raptor_asprintf(&local_48,"%s: %s",api,pcVar2);
  puVar3 = (undefined8 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_40,local_48,&local_49);
  *puVar3 = 1;
  *(int *)(puVar3 + 1) = __errnum;
  puVar3[2] = puVar3 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 2),local_40,local_40 + local_38);
  *(undefined8 **)this = puVar3;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  Free(local_48);
  return (RefCountedPtr<raptor::Status>)(Status *)this;
}

Assistant:

RefCountedPtr<Status> MakeStatusFromPosixError(const char* api) {
    int err = errno;
    char* text = nullptr;
    raptor_asprintf(&text, "%s: %s", api, strerror(err));
    RefCountedPtr<Status> obj = MakeRefCounted<Status>(err, text);
    raptor::Free(text);
    return obj;
}